

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_shapes.cxx
# Opt level: O3

void __thiscall xray_re::xr_shape_object::save(xr_shape_object *this,xr_writer *w)

{
  pointer psVar1;
  undefined4 in_EAX;
  pointer psVar2;
  undefined4 uStack_28;
  int local_24;
  
  uStack_28 = in_EAX;
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_raw_chunk(w,0,&SHAPE_VERSION,2,false);
  xr_writer::open_chunk(w,1);
  _uStack_28 = CONCAT44((int)((ulong)((long)(this->m_shapes).
                                            super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_shapes).
                                           super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                        -0xf0f0f0f,uStack_28);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  psVar2 = (this->m_shapes).
           super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (this->m_shapes).
           super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      uStack_28 = CONCAT13(psVar2->type,(undefined3)uStack_28);
      (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 3,1);
      (*w->_vptr_xr_writer[2])(w,&psVar2->field_1,0x40);
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_shape_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(SHAPE_CHUNK_VERSION, SHAPE_VERSION);
	w.open_chunk(SHAPE_CHUNK_SHAPES);
	w.w_size_u32(m_shapes.size());
	w.w_seq(m_shapes, write_shape());
	w.close_chunk();
}